

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O0

void __thiscall license::locate::EnvironmentVarData::~EnvironmentVarData(EnvironmentVarData *this)

{
  EnvironmentVarData *this_local;
  
  ~EnvironmentVarData(this);
  operator_delete(this);
  return;
}

Assistant:

EnvironmentVarData::~EnvironmentVarData() {}